

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O2

void __thiscall
spvtools::utils::anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(ErrorMsgStream *this)

{
  string local_30 [32];
  
  if ((this->error_msg_sink_ != (string *)0x0) &&
     ((this->stream_)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)this->error_msg_sink_,local_30);
    std::__cxx11::string::_M_dispose();
  }
  std::
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->stream_);
  return;
}

Assistant:

~ErrorMsgStream() {
    if (error_msg_sink_ && stream_) *error_msg_sink_ = stream_->str();
  }